

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 HashmapMergeSort(jx9_hashmap *pMap,ProcNodeCmp xCmp,void *pCmpData)

{
  jx9_hashmap_node *pjVar1;
  ulong uVar2;
  jx9_hashmap_node *pB;
  long lVar3;
  bool bVar4;
  jx9_hashmap_node *a [32];
  undefined8 local_128;
  jx9_hashmap_node *local_120 [31];
  
  uVar2 = 0xfffffffffffffffc;
  do {
    *(undefined4 *)((long)local_120 + (uVar2 - 4)) = 0;
    uVar2 = uVar2 + 4;
  } while (uVar2 < 0xfc);
  pjVar1 = pMap->pFirst;
  do {
    pB = pjVar1;
    if (pB == (jx9_hashmap_node *)0x0) {
      lVar3 = 1;
      do {
        local_128 = HashmapNodeMerge(local_128,local_120[lVar3 + -1],xCmp,pCmpData);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x20);
      local_128->pNext = (jx9_hashmap_node *)0x0;
      pMap->pFirst = local_128;
      pMap->pCur = local_128;
      return (sxi32)local_128;
    }
    pjVar1 = pB->pPrev;
    pB->pPrev = (jx9_hashmap_node *)0x0;
    lVar3 = 0;
    do {
      if (local_120[lVar3 + -1] == (jx9_hashmap_node *)0x0) {
        local_120[lVar3 + -1] = pB;
        bVar4 = lVar3 == 0x1f;
        goto LAB_0013a270;
      }
      pB = HashmapNodeMerge(local_120[lVar3 + -1],pB,xCmp,pCmpData);
      local_120[lVar3 + -1] = (jx9_hashmap_node *)0x0;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x1f);
    bVar4 = true;
LAB_0013a270:
    if (bVar4) {
      local_120[0x1e] = HashmapNodeMerge(local_120[0x1e],pB,xCmp,pCmpData);
    }
  } while( true );
}

Assistant:

static sxi32 HashmapMergeSort(jx9_hashmap *pMap, ProcNodeCmp xCmp, void *pCmpData)
{
	jx9_hashmap_node *a[N_SORT_BUCKET], *p, *pIn;
	sxu32 i;
	SyZero(a, sizeof(a));
	/* Point to the first inserted entry */
	pIn = pMap->pFirst;
	while( pIn ){
		p = pIn;
		pIn = p->pPrev;
		p->pPrev = 0;
		for(i=0; i<N_SORT_BUCKET-1; i++){
			if( a[i]==0 ){
				a[i] = p;
				break;
			}else{
				p = HashmapNodeMerge(a[i], p, xCmp, pCmpData);
				a[i] = 0;
			}
		}
		if( i==N_SORT_BUCKET-1 ){
			/* To get here, there need to be 2^(N_SORT_BUCKET) elements in he input list.
			 * But that is impossible.
			 */
			a[i] = HashmapNodeMerge(a[i], p, xCmp, pCmpData);
		}
	}
	p = a[0];
	for(i=1; i<N_SORT_BUCKET; i++){
		p = HashmapNodeMerge(p, a[i], xCmp, pCmpData);
	}
	p->pNext = 0;
	/* Reflect the change */
	pMap->pFirst = p;
	/* Reset the loop cursor */
	pMap->pCur = pMap->pFirst;
	return SXRET_OK;
}